

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uci.cpp
# Opt level: O2

bool uci::parse_command(string *input)

{
  uint *puVar1;
  byte bVar2;
  unique_ptr<options,_std::default_delete<options>_> uVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  __type _Var6;
  undefined3 uVar7;
  int iVar8;
  uint uVar9;
  istream *piVar10;
  ostream *poVar11;
  undefined7 extraout_var;
  ulong uVar12;
  byte bVar13;
  byte bVar14;
  Move *m;
  Move *m_00;
  size_type sVar15;
  undefined1 uVar16;
  char *pcVar17;
  byte bVar18;
  string *this;
  Move *pMVar19;
  long lVar20;
  bool bVar21;
  float fVar22;
  allocator<char> local_5f1;
  ulong local_5f0;
  string cmd;
  Move move;
  int numThreads;
  undefined4 uStack_5a4;
  size_type local_5a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_598;
  string local_588;
  string local_568;
  string local_548;
  Movegen mvs;
  istringstream instream;
  uint auStack_198 [90];
  
  std::__cxx11::istringstream::istringstream((istringstream *)&instream,(string *)input,_S_in);
  cmd._M_dataplus._M_p = (pointer)&cmd.field_2;
  cmd._M_string_length = 0;
  cmd.field_2._M_local_buf[0] = '\0';
LAB_00121dfe:
  while( true ) {
    while( true ) {
      puVar1 = (uint *)((long)auStack_198 + *(long *)(_instream + -0x18));
      *puVar1 = *puVar1 | 0x1000;
      piVar10 = std::operator>>((istream *)&instream,(string *)&cmd);
      sVar5 = cmd._M_string_length;
      _Var4 = cmd._M_dataplus;
      bVar21 = ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0;
      if (bVar21) goto LAB_00122dd0;
      local_5f0 = CONCAT71(local_5f0._1_7_,bVar21);
      for (sVar15 = 0; sVar5 != sVar15; sVar15 = sVar15 + 1) {
        iVar8 = tolower((int)_Var4._M_p[sVar15]);
        _Var4._M_p[sVar15] = (char)iVar8;
      }
      bVar21 = std::operator==(&cmd,"position");
      if ((!bVar21) ||
         (piVar10 = std::operator>>((istream *)&instream,(string *)&cmd),
         ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0)) break;
      _numThreads = (pointer)&local_598;
      local_5a0 = 0;
      local_598._M_local_buf[0] = '\0';
      bVar21 = std::operator==(&cmd,"startpos");
      if (bVar21) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&instream,(string *)&numThreads);
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&mvs,(string *)&START_FEN_abi_cxx11_,_S_in);
        position::setup(&uci_pos,(istringstream *)&mvs);
        load_position((string *)&numThreads);
        std::__cxx11::istringstream::~istringstream((istringstream *)&mvs);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&move,"",(allocator<char> *)&mvs);
        while ((piVar10 = std::operator>>((istream *)&instream,(string *)&cmd),
               ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0 &&
               (bVar21 = std::operator==(&cmd,"moves"), !bVar21))) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mvs,
                         &cmd," ");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&move,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mvs);
          std::__cxx11::string::~string((string *)&mvs);
        }
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&instream,(string *)&numThreads);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mvs,
                       "moves ",(string *)&numThreads);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((string *)&numThreads,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mvs);
        std::__cxx11::string::~string((string *)&mvs);
        std::__cxx11::istringstream::istringstream((istringstream *)&mvs,(string *)&move,_S_in);
        position::setup(&uci_pos,(istringstream *)&mvs);
        load_position((string *)&numThreads);
        std::__cxx11::istringstream::~istringstream((istringstream *)&mvs);
        std::__cxx11::string::~string((string *)&move);
      }
      std::__cxx11::string::~string((string *)&numThreads);
    }
    bVar21 = std::operator==(&cmd,"setoption");
    if (((!bVar21) ||
        (piVar10 = std::operator>>((istream *)&instream,(string *)&cmd),
        ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0)) ||
       (piVar10 = std::operator>>((istream *)&instream,(string *)&cmd),
       ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0)) break;
    bVar21 = std::operator==(&cmd,"hash");
    if (((bVar21) &&
        (piVar10 = std::operator>>((istream *)&instream,(string *)&cmd),
        ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) &&
       (piVar10 = std::operator>>((istream *)&instream,(string *)&cmd),
       ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) {
      iVar8 = atoi(cmd._M_dataplus._M_p);
      uVar3 = opts;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_548,"hashsize",(allocator<char> *)&mvs);
      options::set<int>((options *)
                        uVar3._M_t.super___uniq_ptr_impl<options,_std::default_delete<options>_>.
                        _M_t.super__Tuple_impl<0UL,_options_*,_std::default_delete<options>_>.
                        super__Head_base<0UL,_options_*,_false>._M_head_impl,&local_548,iVar8);
      std::__cxx11::string::~string((string *)&local_548);
      hash_table::resize(&ttable,(long)iVar8);
      uVar16 = 1;
      goto LAB_00122dd3;
    }
    bVar21 = std::operator==(&cmd,"clear");
    if (((bVar21) &&
        (piVar10 = std::operator>>((istream *)&instream,(string *)&cmd),
        ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) &&
       (bVar21 = std::operator==(&cmd,"hash"), bVar21)) {
      hash_table::clear(&ttable);
    }
    bVar21 = std::operator==(&cmd,"threads");
    if (((bVar21) &&
        (piVar10 = std::operator>>((istream *)&instream,(string *)&cmd),
        ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) &&
       (piVar10 = std::operator>>((istream *)&instream,(string *)&cmd), uVar3 = opts,
       ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_568,"threads",(allocator<char> *)&mvs);
      iVar8 = atoi(cmd._M_dataplus._M_p);
      options::set<int>((options *)
                        uVar3._M_t.super___uniq_ptr_impl<options,_std::default_delete<options>_>.
                        _M_t.super__Tuple_impl<0UL,_options_*,_std::default_delete<options>_>.
                        super__Head_base<0UL,_options_*,_false>._M_head_impl,&local_568,iVar8);
      this = &local_568;
      goto LAB_00122dcb;
    }
    bVar21 = std::operator==(&cmd,"multipv");
    if (((bVar21) &&
        (piVar10 = std::operator>>((istream *)&instream,(string *)&cmd),
        ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) &&
       (piVar10 = std::operator>>((istream *)&instream,(string *)&cmd), uVar3 = opts,
       ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_588,"multipv",(allocator<char> *)&mvs);
      iVar8 = atoi(cmd._M_dataplus._M_p);
      options::set<int>((options *)
                        uVar3._M_t.super___uniq_ptr_impl<options,_std::default_delete<options>_>.
                        _M_t.super__Tuple_impl<0UL,_options_*,_std::default_delete<options>_>.
                        super__Head_base<0UL,_options_*,_false>._M_head_impl,&local_588,iVar8);
      this = &local_588;
LAB_00122dcb:
      std::__cxx11::string::~string((string *)this);
LAB_00122dd0:
      uVar16 = 1;
LAB_00122dd3:
      std::__cxx11::string::~string((string *)&cmd);
      std::__cxx11::istringstream::~istringstream((istringstream *)&instream);
      return (bool)uVar16;
    }
  }
  bVar21 = std::operator==(&cmd,"d");
  if (bVar21) {
    position::print(&uci_pos);
    poVar11 = std::operator<<((ostream *)&std::cout,"position hash key: ");
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    std::endl<char,std::char_traits<char>>(poVar11);
    poVar11 = std::operator<<((ostream *)&std::cout,"fen: ");
    position::to_fen_abi_cxx11_((string *)&mvs,&uci_pos);
    poVar11 = std::operator<<(poVar11,(string *)&mvs);
    std::endl<char,std::char_traits<char>>(poVar11);
    std::__cxx11::string::~string((string *)&mvs);
    goto LAB_00121dfe;
  }
  bVar21 = std::operator==(&cmd,"eval");
  if (bVar21) {
    position::print(&uci_pos);
    poVar11 = std::operator<<((ostream *)&std::cout,"position hash key: ");
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    std::endl<char,std::char_traits<char>>(poVar11);
    poVar11 = std::operator<<((ostream *)&std::cout,"evaluation: ");
    mvs.last = -0x40800000;
    fVar22 = eval::evaluate(&uci_pos,*SearchThreads.workers.
                                      super__Vector_base<Searchthread_*,_std::allocator<Searchthread_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start,(float *)&mvs);
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,fVar22);
    std::endl<char,std::char_traits<char>>(poVar11);
    goto LAB_00121dfe;
  }
  bVar21 = std::operator==(&cmd,"undo");
  if (bVar21) {
    position::undo_move(&uci_pos,&dbgmove);
    goto LAB_00121dfe;
  }
  bVar21 = std::operator==(&cmd,"fdepth");
  if ((bVar21) &&
     (piVar10 = std::operator>>((istream *)&instream,(string *)&cmd),
     ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) {
    uci_pos.params.fixed_depth = atoi(cmd._M_dataplus._M_p);
    poVar11 = std::operator<<((ostream *)&std::cout,"fixed depth search: ");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,uci_pos.params.fixed_depth);
LAB_00122438:
    std::endl<char,std::char_traits<char>>(poVar11);
    goto LAB_00121dfe;
  }
  bVar21 = std::operator==(&cmd,"see");
  if ((bVar21) &&
     (piVar10 = std::operator>>((istream *)&instream,(string *)&cmd),
     ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) {
    Movegen::Movegen(&mvs,&uci_pos);
    Movegen::generate<(Movetype)14,(Piece)6>(&mvs);
    move.f = '\0';
    move.t = '\0';
    move.type = '\x11';
    pMVar19 = mvs.list;
    for (lVar20 = 0; lVar20 < mvs.last; lVar20 = lVar20 + 1) {
      bVar21 = position::is_legal(&uci_pos,pMVar19);
      if (bVar21) {
        move_to_string_abi_cxx11_((string *)&numThreads,(uci *)pMVar19,m);
        _Var6 = std::operator==((string *)&numThreads,&cmd);
        std::__cxx11::string::~string((string *)&numThreads);
        if (_Var6) {
          move.f = pMVar19->f;
          move.t = pMVar19->t;
          move.type = pMVar19->type;
          break;
        }
      }
      pMVar19 = pMVar19 + 1;
    }
    if (move.type == '\x11') {
      poVar11 = std::operator<<((ostream *)&std::cout," (dbg) See : error, illegal move.");
      std::endl<char,std::char_traits<char>>(poVar11);
    }
    else {
      iVar8 = position::see_move(&uci_pos,&move);
      poVar11 = std::operator<<((ostream *)&std::cout,"See score:  ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar8);
      std::endl<char,std::char_traits<char>>(poVar11);
    }
  }
  else {
    bVar21 = std::operator==(&cmd,"domove");
    if ((!bVar21) ||
       (piVar10 = std::operator>>((istream *)&instream,(string *)&cmd),
       ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0)) {
      bVar21 = std::operator==(&cmd,"debug");
      if (bVar21) {
        uci_pos.debug_search = (bool)(uci_pos.debug_search ^ 1);
        poVar11 = std::operator<<((ostream *)&std::cout,"debugging set to: ");
        poVar11 = std::ostream::_M_insert<bool>(SUB81(poVar11,0));
        goto LAB_00122438;
      }
      bVar21 = std::operator==(&cmd,"isready");
      if (bVar21) {
        hash_table::clear(&ttable);
        pcVar17 = "readyok";
      }
      else {
        if (((Search::searching & 1) == 0) && (bVar21 = std::operator==(&cmd,"go"), bVar21)) {
          mvs.list[4].f = '\0';
          mvs.list[4].t = '\0';
          mvs.list[4].type = '\0';
          mvs.list[5].f = '\0';
          mvs.list[5].t = '\0';
          mvs.list[5].type = '\0';
          mvs.list[6].f = '\0';
          mvs.list[6].t = '\0';
          mvs.list[6].type = '\0';
          mvs.list[7].f = '\0';
          mvs.list[7].t = '\0';
          mvs.list[7].type = '\0';
          mvs.list[8].f = '\0';
          mvs.list[8].t = '\0';
          mvs.list[8].type = '\0';
          mvs.list[9].f = '\0';
          mvs.last = 0;
          mvs.list[0].f = '\0';
          mvs.list[0].t = '\0';
          mvs.list[0].type = '\0';
          mvs.list[1].f = '\0';
          mvs.list[1].t = '\0';
          mvs.list[1].type = '\0';
          mvs.list[2].f = '\0';
          mvs.list[2].t = '\0';
          mvs.list[2].type = '\0';
          mvs.list[3].f = '\0';
          mvs.list[3].t = '\0';
          mvs.list[3].type = '\0';
          mvs.list[9].t = '\0';
          mvs.list[9].type = '\0';
          mvs.list[10].f = '\0';
          mvs.list[10].t = '\0';
          mvs.list[10].type = '\0';
          mvs.list[0xb].f = '\0';
          mvs.list[0xb].t = '\0';
          mvs.list[0xb].type = '\0';
          while (piVar10 = std::operator>>((istream *)&instream,(string *)&cmd),
                ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0) {
            bVar21 = std::operator==(&cmd,"wtime");
            if ((bVar21) &&
               (piVar10 = std::operator>>((istream *)&instream,(string *)&cmd),
               ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) {
              iVar8 = atoi(cmd._M_dataplus._M_p);
              mvs.last = iVar8;
            }
            else {
              bVar21 = std::operator==(&cmd,"btime");
              if ((bVar21) &&
                 (piVar10 = std::operator>>((istream *)&instream,(string *)&cmd),
                 ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) {
                iVar8 = atoi(cmd._M_dataplus._M_p);
                uVar7 = (undefined3)iVar8;
                mvs.list[0].f = (char)uVar7;
                mvs.list[0].t = (char)((uint3)uVar7 >> 8);
                mvs.list[0].type = (char)((uint3)uVar7 >> 0x10);
                mvs.list[1].f = (char)((uint)iVar8 >> 0x18);
              }
              else {
                bVar21 = std::operator==(&cmd,"winc");
                if ((bVar21) &&
                   (piVar10 = std::operator>>((istream *)&instream,(string *)&cmd),
                   ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) {
                  iVar8 = atoi(cmd._M_dataplus._M_p);
                  mvs.list[1].t = (char)iVar8;
                  mvs.list[1].type = (char)((uint)iVar8 >> 8);
                  mvs.list[2].f = (char)((uint)iVar8 >> 0x10);
                  mvs.list[2].t = (char)((uint)iVar8 >> 0x18);
                }
                else {
                  bVar21 = std::operator==(&cmd,"binc");
                  if ((bVar21) &&
                     (piVar10 = std::operator>>((istream *)&instream,(string *)&cmd),
                     ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) {
                    iVar8 = atoi(cmd._M_dataplus._M_p);
                    uVar7 = (undefined3)((uint)iVar8 >> 8);
                    mvs.list[2].type = (char)iVar8;
                    mvs.list[3].f = (char)uVar7;
                    mvs.list[3].t = (char)((uint3)uVar7 >> 8);
                    mvs.list[3].type = (char)((uint3)uVar7 >> 0x10);
                  }
                  else {
                    bVar21 = std::operator==(&cmd,"movestogo");
                    if ((bVar21) &&
                       (piVar10 = std::operator>>((istream *)&instream,(string *)&cmd),
                       ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) {
                      iVar8 = atoi(cmd._M_dataplus._M_p);
                      uVar7 = (undefined3)iVar8;
                      mvs.list[4].f = (char)uVar7;
                      mvs.list[4].t = (char)((uint3)uVar7 >> 8);
                      mvs.list[4].type = (char)((uint3)uVar7 >> 0x10);
                      mvs.list[5].f = (char)((uint)iVar8 >> 0x18);
                    }
                    else {
                      bVar21 = std::operator==(&cmd,"nodes");
                      if ((bVar21) &&
                         (piVar10 = std::operator>>((istream *)&instream,(string *)&cmd),
                         ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) {
                        iVar8 = atoi(cmd._M_dataplus._M_p);
                        mvs.list[5].t = (char)iVar8;
                        mvs.list[5].type = (char)((uint)iVar8 >> 8);
                        mvs.list[6].f = (char)((uint)iVar8 >> 0x10);
                        mvs.list[6].t = (char)((uint)iVar8 >> 0x18);
                      }
                      else {
                        bVar21 = std::operator==(&cmd,"movetime");
                        if ((bVar21) &&
                           (piVar10 = std::operator>>((istream *)&instream,(string *)&cmd),
                           ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)) {
                          iVar8 = atoi(cmd._M_dataplus._M_p);
                          uVar7 = (undefined3)((uint)iVar8 >> 8);
                          mvs.list[6].type = (char)iVar8;
                          mvs.list[7].f = (char)uVar7;
                          mvs.list[7].t = (char)((uint3)uVar7 >> 8);
                          mvs.list[7].type = (char)((uint3)uVar7 >> 0x10);
                        }
                        else {
                          bVar21 = std::operator==(&cmd,"mate");
                          if ((bVar21) &&
                             (piVar10 = std::operator>>((istream *)&instream,(string *)&cmd),
                             ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0))
                          {
                            iVar8 = atoi(cmd._M_dataplus._M_p);
                            uVar7 = (undefined3)iVar8;
                            mvs.list[8].f = (char)uVar7;
                            mvs.list[8].t = (char)((uint3)uVar7 >> 8);
                            mvs.list[8].type = (char)((uint3)uVar7 >> 0x10);
                            mvs.list[9].f = (char)((uint)iVar8 >> 0x18);
                          }
                          else {
                            bVar21 = std::operator==(&cmd,"depth");
                            if ((bVar21) &&
                               (piVar10 = std::operator>>((istream *)&instream,(string *)&cmd),
                               ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0)
                               ) {
                              iVar8 = atoi(cmd._M_dataplus._M_p);
                              mvs.list[9].t = (char)iVar8;
                              mvs.list[9].type = (char)((uint)iVar8 >> 8);
                              mvs.list[10].f = (char)((uint)iVar8 >> 0x10);
                              mvs.list[10].t = (char)((uint)iVar8 >> 0x18);
                            }
                            else {
                              bVar21 = std::operator==(&cmd,"infinite");
                              if (bVar21) {
                                bVar21 = std::operator==(&cmd,"infinite");
                                mvs.list[10].type = bVar21;
                              }
                              else {
                                bVar21 = std::operator==(&cmd,"ponder");
                                if (bVar21) {
                                  iVar8 = atoi(cmd._M_dataplus._M_p);
                                  mvs.list[0xb].f = iVar8 != 0;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          uVar9 = options::value<int>((options *)
                                      opts._M_t.
                                      super___uniq_ptr_impl<options,_std::default_delete<options>_>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_options_*,_std::default_delete<options>_>
                                      .super__Head_base<0UL,_options_*,_false>._M_head_impl,
                                      "threads");
          uVar12 = (ulong)uVar9;
          if ((int)uVar9 < 2) {
            uVar12 = 1;
          }
          numThreads = (int)uVar12;
          if ((long)SearchThreads.workers.
                    super__Vector_base<Searchthread_*,_std::allocator<Searchthread_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)SearchThreads.workers.
                    super__Vector_base<Searchthread_*,_std::allocator<Searchthread_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3 != uVar12) {
            Threadpool<Searchthread>::init(&SearchThreads,(EVP_PKEY_CTX *)&numThreads);
          }
          move._0_2_ = move._0_2_ & 0xff00;
          Threadpool<Workerthread>::enqueue<void(&)(position&,limits&,bool),position&,limits&,bool&>
                    (&worker,Search::start,&uci_pos,(limits *)&mvs,(bool *)&move);
          goto LAB_00121dfe;
        }
        bVar21 = std::operator==(&cmd,"stop");
        if (bVar21) {
          UCI_SIGNALS.stop = true;
          goto LAB_00121dfe;
        }
        bVar21 = std::operator==(&cmd,"moves");
        if (bVar21) {
          Movegen::Movegen(&mvs,&uci_pos);
          Movegen::generate<(Movetype)14,(Piece)6>(&mvs);
          pMVar19 = mvs.list;
          for (lVar20 = 0; lVar20 < mvs.last; lVar20 = lVar20 + 1) {
            bVar21 = position::is_legal(&uci_pos,pMVar19);
            if (bVar21) {
              move_to_string_abi_cxx11_((string *)&numThreads,(uci *)pMVar19,m_00);
              poVar11 = std::operator<<((ostream *)&std::cout,(string *)&numThreads);
              std::operator<<(poVar11," ");
              std::__cxx11::string::~string((string *)&numThreads);
            }
            pMVar19 = pMVar19 + 1;
          }
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          goto LAB_00122bac;
        }
        bVar21 = std::operator==(&cmd,"ucinewgame");
        if (bVar21) {
          hash_table::clear(&ttable);
          position::clear(&uci_pos);
          goto LAB_00121dfe;
        }
        bVar21 = std::operator==(&cmd,"uci");
        if (!bVar21) {
          bVar21 = std::operator==(&cmd,"exit");
          if (bVar21) {
            uVar16 = (undefined1)local_5f0;
          }
          else {
            bVar21 = std::operator==(&cmd,"quit");
            uVar16 = (undefined1)local_5f0;
            if (!bVar21) {
              poVar11 = std::operator<<((ostream *)&std::cout,"unknown command: ");
              poVar11 = std::operator<<(poVar11,(string *)&cmd);
              goto LAB_00122438;
            }
          }
          goto LAB_00122dd3;
        }
        hash_table::clear(&ttable);
        position::clear(&uci_pos);
        poVar11 = std::operator<<((ostream *)&std::cout,"id name haVoc");
        std::endl<char,std::char_traits<char>>(poVar11);
        poVar11 = std::operator<<((ostream *)&std::cout,"id author M.Glatzmaier");
        std::endl<char,std::char_traits<char>>(poVar11);
        poVar11 = std::operator<<((ostream *)&std::cout,
                                  "option name Threads type spin default 1 min 1 max 1024");
        std::endl<char,std::char_traits<char>>(poVar11);
        poVar11 = std::operator<<((ostream *)&std::cout,
                                  "option name Hash type spin default 1024 min 1 max 33554432");
        std::endl<char,std::char_traits<char>>(poVar11);
        poVar11 = std::operator<<((ostream *)&std::cout,
                                  "option name MultiPV type spin default 1 min 1 max 4");
        std::endl<char,std::char_traits<char>>(poVar11);
        pcVar17 = "uciok";
      }
      poVar11 = std::operator<<((ostream *)&std::cout,pcVar17);
      goto LAB_00122438;
    }
    Movegen::Movegen(&mvs,&uci_pos);
    Movegen::generate<(Movetype)14,(Piece)6>(&mvs);
    pMVar19 = mvs.list;
    local_5f0 = 0;
    for (lVar20 = 0; lVar20 < mvs.last; lVar20 = lVar20 + 1) {
      bVar21 = position::is_legal(&uci_pos,pMVar19);
      if (bVar21) {
        std::operator+((string *)&numThreads,SanSquares_abi_cxx11_ + pMVar19->f,
                       SanSquares_abi_cxx11_ + pMVar19->t);
        std::__cxx11::string::string<std::allocator<char>>((string *)&move,"",&local_5f1);
        bVar2 = pMVar19->type;
        if (bVar2 < 4) {
          bVar18 = 2;
          bVar14 = 1;
          bVar13 = 0;
LAB_001228b4:
          pcVar17 = "b";
          if (bVar2 != bVar18) {
            pcVar17 = "n";
          }
          if (bVar2 == bVar14) {
            pcVar17 = "r";
          }
          if (bVar2 == bVar13) {
            pcVar17 = "q";
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&move,
                     pcVar17);
        }
        else if (bVar2 < 8) {
          bVar18 = 6;
          bVar14 = 5;
          bVar13 = 4;
          goto LAB_001228b4;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((string *)&numThreads,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&move);
        _Var6 = std::operator==((string *)&numThreads,&cmd);
        if (_Var6) {
          dbgmove.f = pMVar19->f;
          dbgmove.type = pMVar19->type;
          dbgmove.t = pMVar19->t;
          local_5f0 = CONCAT71(extraout_var,1);
        }
        std::__cxx11::string::~string((string *)&move);
        std::__cxx11::string::~string((string *)&numThreads);
        if (_Var6) break;
      }
      pMVar19 = pMVar19 + 1;
    }
    if ((local_5f0 & 1) == 0) {
      poVar11 = std::operator<<((ostream *)&std::cout,(string *)&cmd);
      poVar11 = std::operator<<(poVar11," is not a legal move");
      std::endl<char,std::char_traits<char>>(poVar11);
    }
    else {
      poVar11 = std::operator<<((ostream *)&std::cout,"doing mv ");
      std::endl<char,std::char_traits<char>>(poVar11);
      position::do_move(&uci_pos,&dbgmove);
    }
  }
LAB_00122bac:
  Movegen::~Movegen(&mvs);
  goto LAB_00121dfe;
}

Assistant:

bool uci::parse_command(const std::string& input) {
	std::istringstream instream(input);
	std::string cmd;
	bool running = true;

	while (instream >> std::skipws >> cmd) {
		std::transform(cmd.begin(), cmd.end(), cmd.begin(), ::tolower);

		if (cmd == "position" && instream >> cmd) {

			std::string tmp;
			if (cmd == "startpos") {
				getline(instream, tmp);
				std::istringstream fen(START_FEN);
				uci_pos.setup(fen);
				load_position(tmp);
			}
			else {
				std::string sfen = "";
				while ((instream >> cmd) && cmd != "moves") sfen += cmd + " ";
				getline(instream, tmp);
				tmp = "moves " + tmp;
				std::istringstream fen(sfen);
				uci_pos.setup(fen);
				load_position(tmp);
			}
		}
		else if (cmd == "setoption" && instream >> cmd && instream >> cmd)
		{
			if (cmd == "hash" && instream >> cmd && instream >> cmd)
			{
				auto sz = atoi(cmd.c_str());
				opts->set("hashsize", sz);
				ttable.resize(sz);
				break;
			}
			if (cmd == "clear" && instream >> cmd)
			{
				if (cmd == "hash")
					ttable.clear();
			}
			if (cmd == "threads" && instream >> cmd && instream >> cmd)
			{
				opts->set("threads", atoi(cmd.c_str()));
				break;
			}
			if (cmd == "multipv" && instream >> cmd && instream >> cmd)
			{
				opts->set("multipv", atoi(cmd.c_str()));
				break;
			}
		}
		else if (cmd == "d") {
			uci_pos.print();
			std::cout << "position hash key: " << uci_pos.key() << std::endl;
			std::cout << "fen: " << uci_pos.to_fen() << std::endl;
		}
		else if (cmd == "eval") {
			uci_pos.print();
			std::cout << "position hash key: " << uci_pos.key() << std::endl;
			std::cout << "evaluation: " << eval::evaluate(uci_pos, *SearchThreads[0], -1) << std::endl;
		}
		else if (cmd == "undo") {
			uci_pos.undo_move(dbgmove);
		}
		else if (cmd == "fdepth" && instream >> cmd) {
			uci_pos.params.fixed_depth = atoi(cmd.c_str());
			std::cout << "fixed depth search: " << uci_pos.params.fixed_depth << std::endl;
		}

		else if (cmd == "see" && instream >> cmd) {
			Movegen mvs(uci_pos);
			mvs.generate<pseudo_legal, pieces>();
			Move move;


			for (int i = 0; i < mvs.size(); ++i) {

				if (!uci_pos.is_legal(mvs[i])) continue;

				if (move_to_string(mvs[i]) == cmd) {
					move = mvs[i];
					break;
				}

			}

			if (move.type != Movetype::no_type) {
				int score = uci_pos.see_move(move);
				std::cout << "See score:  " << score << std::endl;
			}
			else std::cout << " (dbg) See : error, illegal move." << std::endl;
		}
		//else if (cmd == "evaltune") {
		//	auto& tm = haVoc::Tuningmanager::instance();
		//	tm.tune_evaluation();
		//}
		else if (cmd == "domove" && instream >> cmd) {
			Movegen mvs(uci_pos);
			bool isok = false;
			mvs.generate<pseudo_legal, pieces>();
			for (int i = 0; i < mvs.size(); ++i) {
				if (!uci_pos.is_legal(mvs[i])) continue;
				std::string tmp = SanSquares[mvs[i].f] + SanSquares[mvs[i].t];
				std::string ps = "";
				Movetype t = Movetype(mvs[i].type);

				if (t >= 0 && t < capture_promotion_q) {
					ps = (t == 0 ? "q" :
						t == 1 ? "r" :
						t == 2 ? "b" : "n");
				}
				else if (t >= capture_promotion_q && t < castle_ks) {
					ps = (t == 4 ? "q" :
						t == 5 ? "r" :
						t == 6 ? "b" : "n");
				}
				tmp += ps;

				if (tmp == cmd) {
					dbgmove.set(mvs[i].f, mvs[i].t, Movetype(mvs[i].type));
					isok = true;
					break;
				}
			}
			if (isok) {
				std::cout << "doing mv " << std::endl;
				uci_pos.do_move(dbgmove);
			}
			else std::cout << cmd << " is not a legal move" << std::endl;
		}
		else if (cmd == "debug") {
			uci_pos.debug_search = !uci_pos.debug_search;
			std::cout << "debugging set to: " << uci_pos.debug_search << std::endl;
		}

		// game specific uci commands (refactor?)
		else if (cmd == "isready") {
			ttable.clear();
			std::cout << "readyok" << std::endl;
		}
		else if (!Search::searching && cmd == "go") {
			limits lims;
			memset(&lims, 0, sizeof(limits));

			while (instream >> cmd)
			{
				if (cmd == "wtime" && instream >> cmd) lims.wtime = atoi(cmd.c_str());
				else if (cmd == "btime" && instream >> cmd) lims.btime = atoi(cmd.c_str());
				else if (cmd == "winc" && instream >> cmd) lims.winc = atoi(cmd.c_str());
				else if (cmd == "binc" && instream >> cmd) lims.binc = atoi(cmd.c_str());
				else if (cmd == "movestogo" && instream >> cmd) lims.movestogo = atoi(cmd.c_str());
				else if (cmd == "nodes" && instream >> cmd) lims.nodes = atoi(cmd.c_str());
				else if (cmd == "movetime" && instream >> cmd) lims.movetime = atoi(cmd.c_str());
				else if (cmd == "mate" && instream >> cmd) lims.mate = atoi(cmd.c_str());
				else if (cmd == "depth" && instream >> cmd) lims.depth = atoi(cmd.c_str());
				else if (cmd == "infinite") lims.infinite = (cmd == "infinite" ? true : false);
				else if (cmd == "ponder") lims.ponder = atoi(cmd.c_str());
			}

			// Set search threads
			int numThreads = std::max(opts->value<int>("threads"), 1);
			if (numThreads != SearchThreads.num_workers())
				SearchThreads.init(numThreads);

			bool silent = false;
			worker.enqueue(Search::start, uci_pos, lims, silent);
		}
		else if (cmd == "stop") {
			UCI_SIGNALS.stop = true;
		}
		else if (cmd == "moves") {
			Movegen mvs(uci_pos);
			mvs.generate<pseudo_legal, pieces>();
			for (int i = 0; i < mvs.size(); ++i) {
				if (!uci_pos.is_legal(mvs[i])) 
					continue;
				std::cout << move_to_string(mvs[i]) << " ";
			}
			std::cout << std::endl;
		}
		else if (cmd == "ucinewgame") {
			ttable.clear();
			uci_pos.clear();
		}
		else if (cmd == "uci") {
			ttable.clear();
			uci_pos.clear();
			std::cout << "id name haVoc" << std::endl;
			std::cout << "id author M.Glatzmaier" << std::endl;
			std::cout << "option name Threads type spin default 1 min 1 max 1024" << std::endl;
			std::cout << "option name Hash type spin default 1024 min 1 max 33554432" << std::endl;
			std::cout << "option name MultiPV type spin default 1 min 1 max 4" << std::endl;
			std::cout << "uciok" << std::endl;
		}

		else if (cmd == "exit" || cmd == "quit") {
			running = false;
			break;
		}
		else std::cout << "unknown command: " << cmd << std::endl;

	}
	return running;
}